

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall gl4cts::TextureViewTestGetTexParameter::deinit(TextureViewTestGetTexParameter *this)

{
  _test_run *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  GLuint *pGVar4;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  for (pGVar4 = &((this->m_test_runs).
                  super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 texture_view_object_created_from_view_to_id;
      (_test_run *)(pGVar4 + -7) !=
      (this->m_test_runs).
      super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
      ._M_impl.super__Vector_impl_data._M_finish; pGVar4 = pGVar4 + 10) {
    if (pGVar4[-2] != 0) {
      (**(code **)(lVar3 + 0x480))(1,pGVar4 + -2);
      pGVar4[-2] = 0;
    }
    if (pGVar4[-1] != 0) {
      (**(code **)(lVar3 + 0x480))(1,pGVar4 + -1);
      pGVar4[-1] = 0;
    }
    if (*pGVar4 != 0) {
      (**(code **)(lVar3 + 0x480))(1,pGVar4);
      *pGVar4 = 0;
    }
  }
  p_Var1 = (this->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((_test_run *)(pGVar4 + -7) != p_Var1) {
    (this->m_test_runs).
    super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var1;
  }
  return;
}

Assistant:

void TextureViewTestGetTexParameter::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Deinitialize all test runs */
	for (_test_runs_iterator it = m_test_runs.begin(); it != m_test_runs.end(); ++it)
	{
		_test_run& test_run = *it;

		if (test_run.parent_texture_object_id != 0)
		{
			gl.deleteTextures(1, &test_run.parent_texture_object_id);

			test_run.parent_texture_object_id = 0;
		}

		if (test_run.texture_view_object_created_from_immutable_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_immutable_to_id);

			test_run.texture_view_object_created_from_immutable_to_id = 0;
		}

		if (test_run.texture_view_object_created_from_view_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_view_to_id);

			test_run.texture_view_object_created_from_view_to_id = 0;
		}
	}
	m_test_runs.clear();
}